

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  iovec *piVar2;
  int code;
  undefined1 *puVar3;
  long lVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  undefined1 *puVar6;
  long lVar7;
  iovec *piVar8;
  iovec *__iovec;
  Fault f;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  Fault local_160;
  iovec *local_158;
  undefined1 *puStack_150;
  undefined8 *local_148;
  iovec local_138 [16];
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  if ((void *)0x400 < __buf) {
    do {
      (*(this->super_OutputStream)._vptr_OutputStream[3])(this,lVar7,0x400);
      lVar7 = lVar7 + 0x4000;
      __buf = (void *)((long)__buf + -0x400);
    } while ((undefined1 *)0x400 < __buf);
  }
  if (&DAT_00000010 < __buf) {
    local_158 = (iovec *)_::HeapArrayDisposer::allocateImpl
                                   (0x10,(size_t)__buf,(size_t)__buf,(_func_void_void_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
    local_148 = &_::HeapArrayDisposer::instance;
    puStack_150 = (undefined1 *)__buf;
  }
  else {
    local_158 = (iovec *)0x0;
    puStack_150 = (undefined1 *)0x0;
    local_148 = (undefined8 *)0x0;
  }
  puVar3 = puStack_150;
  if (__buf < (undefined1 *)0x11) {
    puVar3 = (undefined1 *)__buf;
  }
  __iovec = local_138;
  if (__buf >= (undefined1 *)0x11) {
    __iovec = local_158;
  }
  if ((undefined1 *)__buf != (undefined1 *)0x0) {
    lVar4 = 8;
    uVar5 = 1;
    do {
      *(undefined8 *)((long)__iovec + lVar4 + -8) = *(undefined8 *)(lVar7 + -8 + lVar4);
      *(undefined8 *)((long)&__iovec->iov_base + lVar4) = *(undefined8 *)(lVar7 + lVar4);
      puVar6 = (undefined1 *)(ulong)uVar5;
      lVar4 = lVar4 + 0x10;
      uVar5 = uVar5 + 1;
    } while (puVar6 < __buf);
  }
  piVar8 = __iovec + (long)puVar3;
  if (0 < (long)puVar3) {
    do {
      if (__iovec->iov_len != 0) break;
      __iovec = __iovec + 1;
    } while (__iovec < piVar8);
  }
  do {
    puVar6 = puStack_150;
    piVar2 = local_158;
    if (piVar8 <= __iovec) {
      if (local_158 != (iovec *)0x0) {
        local_158 = (iovec *)0x0;
        puStack_150 = (undefined1 *)0x0;
        puVar3 = (undefined1 *)(**(code **)*local_148)(local_148,piVar2,0x10,puVar6,puVar6,0);
      }
      return (ssize_t)puVar3;
    }
    do {
      puVar3 = (undefined1 *)
               writev(this->fd,__iovec,(int)((ulong)((long)piVar8 - (long)__iovec) >> 4));
      if (-1 < (long)puVar3) {
        code = 0;
        break;
      }
      code = _::Debug::getOsErrorNumber(false);
    } while (code == -1);
    if (code != 0) {
      _::Debug::Fault::Fault<int,int&>
                (&local_160,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x196,code,"n = ::writev(fd, current, iov.end() - current)","fd",&this->fd);
      _::Debug::Fault::fatal(&local_160);
    }
    if ((long)puVar3 < 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_160,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x197,FAILED,"n > 0","\"writev() returned zero.\"",
                 (char (*) [24])"writev() returned zero.");
      _::Debug::Fault::fatal(&local_160);
    }
    for (; (__iovec < piVar8 && (psVar1 = &__iovec->iov_len, (undefined1 *)*psVar1 <= puVar3));
        __iovec = __iovec + 1) {
      puVar3 = puVar3 + -*psVar1;
    }
    if (0 < (long)puVar3) {
      __iovec->iov_base = (undefined1 *)((long)__iovec->iov_base + (long)puVar3);
      __iovec->iov_len = __iovec->iov_len - (long)puVar3;
    }
  } while( true );
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation

  OutputStream::write(pieces);

#else
  const size_t iovmax = miniposix::iovMax(pieces.size());
  while (pieces.size() > iovmax) {
    write(pieces.slice(0, iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iov.end() - current), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}